

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Context.cpp
# Opt level: O2

DataModelConstructor __thiscall
Rml::Context::CreateDataModel(Context *this,String *name,DataTypeRegister *data_type_register)

{
  NodePtr __p;
  unique_ptr<Rml::DataModel,_std::default_delete<Rml::DataModel>_> uStack_58;
  DataTypeRegister *data_type_register_local;
  DataModelConstructor local_48;
  pair<robin_hood::detail::Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Rml::DataModel,_std::default_delete<Rml::DataModel>_>,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>::Iter<false>,_bool>
  result;
  
  data_type_register_local = data_type_register;
  if ((data_type_register == (DataTypeRegister *)0x0) &&
     (data_type_register_local =
           (this->default_data_type_register)._M_t.
           super___uniq_ptr_impl<Rml::DataTypeRegister,_std::default_delete<Rml::DataTypeRegister>_>
           ._M_t.
           super__Tuple_impl<0UL,_Rml::DataTypeRegister_*,_std::default_delete<Rml::DataTypeRegister>_>
           .super__Head_base<0UL,_Rml::DataTypeRegister_*,_false>._M_head_impl,
     data_type_register_local == (DataTypeRegister *)0x0)) {
    data_type_register_local = data_type_register;
    ::std::make_unique<Rml::DataTypeRegister>();
    __p = result.first.mKeyVals;
    result.first.mKeyVals = (NodePtr)0x0;
    ::std::__uniq_ptr_impl<Rml::DataTypeRegister,_std::default_delete<Rml::DataTypeRegister>_>::
    reset((__uniq_ptr_impl<Rml::DataTypeRegister,_std::default_delete<Rml::DataTypeRegister>_> *)
          &this->default_data_type_register,(pointer)__p);
    ::std::unique_ptr<Rml::DataTypeRegister,_std::default_delete<Rml::DataTypeRegister>_>::
    ~unique_ptr((unique_ptr<Rml::DataTypeRegister,_std::default_delete<Rml::DataTypeRegister>_> *)
                &result);
    data_type_register_local =
         (this->default_data_type_register)._M_t.
         super___uniq_ptr_impl<Rml::DataTypeRegister,_std::default_delete<Rml::DataTypeRegister>_>.
         _M_t.
         super__Tuple_impl<0UL,_Rml::DataTypeRegister_*,_std::default_delete<Rml::DataTypeRegister>_>
         .super__Head_base<0UL,_Rml::DataTypeRegister_*,_false>._M_head_impl;
  }
  ::std::make_unique<Rml::DataModel,Rml::DataTypeRegister*&>((DataTypeRegister **)&uStack_58);
  robin_hood::detail::
  Table<true,80ul,std::__cxx11::string,std::unique_ptr<Rml::DataModel,std::default_delete<Rml::DataModel>>,robin_hood::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>>
  ::
  emplace<std::__cxx11::string_const&,std::unique_ptr<Rml::DataModel,std::default_delete<Rml::DataModel>>>
            (&result,(Table<true,80ul,std::__cxx11::string,std::unique_ptr<Rml::DataModel,std::default_delete<Rml::DataModel>>,robin_hood::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>>
                      *)&this->data_models,name,&uStack_58);
  ::std::unique_ptr<Rml::DataModel,_std::default_delete<Rml::DataModel>_>::~unique_ptr(&uStack_58);
  if (result.second == true) {
    DataModelConstructor::DataModelConstructor
              (&local_48,
               ((result.first.mKeyVals)->mData).second._M_t.
               super___uniq_ptr_impl<Rml::DataModel,_std::default_delete<Rml::DataModel>_>._M_t.
               super__Tuple_impl<0UL,_Rml::DataModel_*,_std::default_delete<Rml::DataModel>_>.
               super__Head_base<0UL,_Rml::DataModel_*,_false>._M_head_impl);
  }
  else {
    Log::Message(LT_ERROR,"Data model name \'%s\' already exists.",(name->_M_dataplus)._M_p);
    DataModelConstructor::DataModelConstructor(&local_48);
  }
  return local_48;
}

Assistant:

DataModelConstructor Context::CreateDataModel(const String& name, DataTypeRegister* data_type_register)
{
	if (!data_type_register)
	{
		if (!default_data_type_register)
			default_data_type_register = MakeUnique<DataTypeRegister>();
		data_type_register = default_data_type_register.get();
	}

	auto result = data_models.emplace(name, MakeUnique<DataModel>(data_type_register));
	bool inserted = result.second;
	if (inserted)
		return DataModelConstructor(result.first->second.get());

	Log::Message(Log::LT_ERROR, "Data model name '%s' already exists.", name.c_str());
	return DataModelConstructor();
}